

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O2

int Abc_NtkSecFraig(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int nSeconds,int nFrames,int fVerbose)

{
  int iVar1;
  Abc_Ntk_t *pMiter;
  int *piVar2;
  Abc_Ntk_t *pMiter_00;
  Fraig_Man_t *p;
  char *__s;
  Fraig_Params_t Params;
  
  pMiter = Abc_NtkMiter(pNtk1,pNtk2,0,0,0,0);
  if (pMiter == (Abc_Ntk_t *)0x0) {
    __s = "Miter computation has failed.";
LAB_00283d29:
    puts(__s);
  }
  else {
    iVar1 = Abc_NtkMiterIsConstant(pMiter);
    if (iVar1 == 1) {
      Abc_NtkDelete(pMiter);
      puts("Networks are equivalent after structural hashing.");
      return 1;
    }
    if (iVar1 == 0) {
      puts("Networks are NOT EQUIVALENT after structural hashing.");
      piVar2 = Abc_NtkVerifyGetCleanModel(pMiter,nFrames);
      pMiter->pModel = piVar2;
      Abc_NtkVerifyReportErrorSeq(pNtk1,pNtk2,piVar2,nFrames);
      if (pMiter->pModel != (int *)0x0) {
        free(pMiter->pModel);
        pMiter->pModel = (int *)0x0;
      }
    }
    else {
      pMiter_00 = Abc_NtkFrames(pMiter,nFrames,1,0);
      Abc_NtkDelete(pMiter);
      if (pMiter_00 == (Abc_Ntk_t *)0x0) {
        __s = "Frames computation has failed.";
        goto LAB_00283d29;
      }
      iVar1 = Abc_NtkMiterIsConstant(pMiter_00);
      if (iVar1 == 1) {
        Abc_NtkDelete(pMiter_00);
        puts("Networks are equivalent after framing.");
        return 1;
      }
      if (iVar1 != 0) {
        Fraig_ParamsSetDefault(&Params);
        Params.nSeconds = nSeconds;
        Params.fVerbose = fVerbose;
        p = (Fraig_Man_t *)Abc_NtkToFraig(pMiter_00,&Params,0,0);
        Fraig_ManProveMiter(p);
        iVar1 = Fraig_ManCheckMiter(p);
        if (iVar1 + 1U < 3) {
          puts(&DAT_006b9a6c + *(int *)(&DAT_006b9a6c + (ulong)(iVar1 + 1U) * 4));
          Fraig_ManFree(p);
          Abc_NtkDelete(pMiter_00);
          return (uint)(iVar1 == 1);
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcVerify.c"
                      ,0x289,"int Abc_NtkSecFraig(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int)");
      }
      puts("Networks are NOT EQUIVALENT after framing.");
      piVar2 = Abc_NtkVerifyGetCleanModel(pMiter_00,1);
      pMiter_00->pModel = piVar2;
      pMiter = pMiter_00;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        pMiter_00->pModel = (int *)0x0;
      }
    }
    Abc_NtkDelete(pMiter);
  }
  return 0;
}

Assistant:

int Abc_NtkSecFraig( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int nSeconds, int nFrames, int fVerbose )
{
    Fraig_Params_t Params;
    Fraig_Man_t * pMan;
    Abc_Ntk_t * pMiter;
    Abc_Ntk_t * pFrames;
    int RetValue;

    // get the miter of the two networks
    pMiter = Abc_NtkMiter( pNtk1, pNtk2, 0, 0, 0, 0 );
    if ( pMiter == NULL )
    {
        printf( "Miter computation has failed.\n" );
        return 0;
    }
    RetValue = Abc_NtkMiterIsConstant( pMiter );
    if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT after structural hashing.\n" );
        // report the error
        pMiter->pModel = Abc_NtkVerifyGetCleanModel( pMiter, nFrames );
        Abc_NtkVerifyReportErrorSeq( pNtk1, pNtk2, pMiter->pModel, nFrames );
        ABC_FREE( pMiter->pModel );
        Abc_NtkDelete( pMiter );
        return 0;
    }
    if ( RetValue == 1 )
    {
        Abc_NtkDelete( pMiter );
        printf( "Networks are equivalent after structural hashing.\n" );
        return 1;
    }

    // create the timeframes
    pFrames = Abc_NtkFrames( pMiter, nFrames, 1, 0 );
    Abc_NtkDelete( pMiter );
    if ( pFrames == NULL )
    {
        printf( "Frames computation has failed.\n" );
        return 0;
    }
    RetValue = Abc_NtkMiterIsConstant( pFrames );
    if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT after framing.\n" );
        // report the error
        pFrames->pModel = Abc_NtkVerifyGetCleanModel( pFrames, 1 );
//        Abc_NtkVerifyReportErrorSeq( pNtk1, pNtk2, pFrames->pModel, nFrames );
        ABC_FREE( pFrames->pModel );
        Abc_NtkDelete( pFrames );
        return 0;
    }
    if ( RetValue == 1 )
    {
        Abc_NtkDelete( pFrames );
        printf( "Networks are equivalent after framing.\n" );
        return 1;
    }

    // convert the miter into a FRAIG
    Fraig_ParamsSetDefault( &Params );
    Params.fVerbose = fVerbose;
    Params.nSeconds = nSeconds;
//    Params.fFuncRed = 0;
//    Params.nPatsRand = 0;
//    Params.nPatsDyna = 0;
    pMan = (Fraig_Man_t *)Abc_NtkToFraig( pFrames, &Params, 0, 0 ); 
    Fraig_ManProveMiter( pMan );

    // analyze the result
    RetValue = Fraig_ManCheckMiter( pMan );
    // report the result
    if ( RetValue == -1 )
        printf( "Networks are undecided (SAT solver timed out on the final miter).\n" );
    else if ( RetValue == 1 )
        printf( "Networks are equivalent after fraiging.\n" );
    else if ( RetValue == 0 )
    {
        printf( "Networks are NOT EQUIVALENT after fraiging.\n" );
//        Abc_NtkVerifyReportErrorSeq( pNtk1, pNtk2, Fraig_ManReadModel(pMan), nFrames );
    }
    else assert( 0 );
    // delete the fraig manager
    Fraig_ManFree( pMan );
    // delete the miter
    Abc_NtkDelete( pFrames );
    return RetValue == 1;
}